

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O0

void __thiscall
Js::StepController::AddToReturnedValueContainer
          (StepController *this,Var returnValue,JavascriptFunction *function,
          bool isValueOfReturnStatement)

{
  Recycler *pRVar1;
  ReturnedValue *this_00;
  TrackAllocData local_58;
  ReturnedValue *local_30;
  ReturnedValue *valuePair;
  JavascriptFunction *pJStack_20;
  bool isValueOfReturnStatement_local;
  JavascriptFunction *function_local;
  Var returnValue_local;
  StepController *this_local;
  
  if (this->pActivatedContext != (ScriptContext *)0x0) {
    valuePair._7_1_ = isValueOfReturnStatement;
    pJStack_20 = function;
    function_local = (JavascriptFunction *)returnValue;
    returnValue_local = this;
    pRVar1 = ScriptContext::GetRecycler(this->pActivatedContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&ReturnedValue::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagProbe.cpp"
               ,0x7a);
    pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_58);
    this_00 = (ReturnedValue *)new<Memory::Recycler>(0x18,pRVar1,0x43c4b0);
    ReturnedValue::ReturnedValue(this_00,function_local,pJStack_20,(bool)(valuePair._7_1_ & 1));
    local_30 = this_00;
    JsUtil::
    List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
              (this->returnedValueList,&local_30);
  }
  return;
}

Assistant:

void StepController::AddToReturnedValueContainer(Js::Var returnValue, Js::JavascriptFunction * function, bool isValueOfReturnStatement)
    {
        if (this->pActivatedContext != nullptr) // This will be null when we execute scripts when on break.
        {
            ReturnedValue *valuePair = RecyclerNew(pActivatedContext->GetRecycler(), ReturnedValue, returnValue, function, isValueOfReturnStatement);
            this->returnedValueList->Add(valuePair);
        }
    }